

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

MemTxResult
flatview_read(uc_struct_conflict15 *uc,FlatView *fv,hwaddr addr,MemTxAttrs attrs,void *buf,
             hwaddr len)

{
  MemTxResult MVar1;
  MemoryRegion_conflict *mr_00;
  MemoryRegion_conflict *mr;
  hwaddr addr1;
  hwaddr l;
  hwaddr len_local;
  void *buf_local;
  hwaddr addr_local;
  FlatView *fv_local;
  uc_struct_conflict15 *uc_local;
  MemTxAttrs attrs_local;
  
  addr1 = len;
  l = len;
  len_local = (hwaddr)buf;
  buf_local = (void *)addr;
  addr_local = (hwaddr)fv;
  fv_local = (FlatView *)uc;
  uc_local._4_4_ = attrs;
  mr_00 = flatview_translate_tricore(uc,fv,addr,(hwaddr *)&mr,&addr1,false,attrs);
  MVar1 = flatview_read_continue_tricore
                    ((uc_struct_conflict15 *)fv_local,(FlatView *)addr_local,(hwaddr)buf_local,
                     uc_local._4_4_,(void *)len_local,l,(hwaddr)mr,addr1,mr_00);
  return MVar1;
}

Assistant:

static MemTxResult flatview_read(struct uc_struct *uc, FlatView *fv, hwaddr addr,
                                 MemTxAttrs attrs, void *buf, hwaddr len)
{
    hwaddr l;
    hwaddr addr1;
    MemoryRegion *mr;

    l = len;
    mr = flatview_translate(uc, fv, addr, &addr1, &l, false, attrs);
    return flatview_read_continue(uc, fv, addr, attrs, buf, len,
                                  addr1, l, mr);
}